

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

QString * fitEntryTypeToUString(QString *__return_storage_ptr__,UINT8 type)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch(type & 0x7f) {
  case 0:
    goto LAB_00162ece;
  case 1:
    psVar1 = (storage_type *)0x9;
    break;
  case 2:
    goto LAB_00162e7b;
  case 3:
    psVar1 = (storage_type *)0xe;
    break;
  case 4:
    psVar1 = (storage_type *)0x14;
    break;
  case 5:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
switchD_00162da6_caseD_5:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)(type & 0x7f));
    return __return_storage_ptr__;
  case 6:
    psVar1 = (storage_type *)0xf;
    break;
  case 7:
    psVar1 = (storage_type *)0x13;
    break;
  case 8:
    goto LAB_00162ece;
  case 9:
LAB_00162e7b:
    psVar1 = (storage_type *)0xb;
    break;
  case 10:
LAB_00162ece:
    psVar1 = (storage_type *)0xa;
    break;
  case 0xb:
    goto LAB_00162f0a;
  case 0xc:
    psVar1 = (storage_type *)0x15;
    break;
  case 0x10:
    psVar1 = (storage_type *)0x17;
    break;
  case 0x1a:
LAB_00162f0a:
    psVar1 = (storage_type *)0x16;
    break;
  case 0x1b:
    goto LAB_00162f1b;
  case 0x1c:
    goto LAB_00162ebd;
  case 0x1d:
    psVar1 = (storage_type *)0x1a;
    break;
  case 0x2c:
    psVar1 = (storage_type *)0x11;
    break;
  case 0x2d:
    goto LAB_00162ebd;
  case 0x2e:
LAB_00162ebd:
    psVar1 = (storage_type *)0x12;
    break;
  case 0x2f:
LAB_00162f1b:
    psVar1 = (storage_type *)0x10;
    break;
  default:
    if ((type & 0x7f) != 0x7f) goto switchD_00162da6_caseD_5;
    psVar1 = (storage_type *)0x5;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

UString fitEntryTypeToUString(const UINT8 type)
{
    switch (type & 0x7F) {
        case INTEL_FIT_TYPE_HEADER:                     return UString("FIT Header");
        case INTEL_FIT_TYPE_MICROCODE:                  return UString("Microcode");
        case INTEL_FIT_TYPE_STARTUP_AC_MODULE:          return UString("Startup ACM");
        case INTEL_FIT_TYPE_DIAG_AC_MODULE:             return UString("Diagnostic ACM");
        case INTEL_FIT_TYPE_PLATFORM_BOOT_POLICY:       return UString("Platform Boot Policy");
        case INTEL_FIT_TYPE_FIT_RESET_STATE:            return UString("FIT Reset State");
        case INTEL_FIT_TYPE_BIOS_STARTUP_MODULE:        return UString("BIOS Startup Module");
        case INTEL_FIT_TYPE_TPM_POLICY:                 return UString("TPM Policy");
        case INTEL_FIT_TYPE_BIOS_POLICY:                return UString("BIOS Policy");
        case INTEL_FIT_TYPE_TXT_POLICY:                 return UString("TXT Policy");
        case INTEL_FIT_TYPE_BOOT_GUARD_KEY_MANIFEST:    return UString("BootGuard Key Manifest");
        case INTEL_FIT_TYPE_BOOT_GUARD_BOOT_POLICY:     return UString("BootGuard Boot Policy");
        case INTEL_FIT_TYPE_CSE_SECURE_BOOT:            return UString("CSE SecureBoot Settings");
        case INTEL_FIT_TYPE_VAB_PROVISIONING_TABLE:     return UString("VAB Provisioning Table");
        case INTEL_FIT_TYPE_VAB_KEY_MANIFEST:           return UString("VAB Key Manifest");
        case INTEL_FIT_TYPE_VAB_IMAGE_MANIFEST:         return UString("VAB Image Manifest");
        case INTEL_FIT_TYPE_VAB_IMAGE_HASH_DESCRIPTORS: return UString("VAB Image Hash Descriptors");
        case INTEL_FIT_TYPE_SACM_DEBUG_RECORD:          return UString("SACM Debug Record");
        case INTEL_FIT_TYPE_ACM_FEATURE_POLICY:         return UString("ACM Feature Policy");
        case INTEL_FIT_TYPE_SCRTM_ERROR_RECORD:         return UString("SCRTM Error Record");
        case INTEL_FIT_TYPE_JMP_DEBUG_POLICY:           return UString("JMP Debug Policy");
        case INTEL_FIT_TYPE_EMPTY:                      return UString("Empty");
    }
    
    return usprintf("Unknown %02Xh", (type & 0x7F));
}